

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleaction.hh
# Opt level: O1

int __thiscall
RuleAndDistribute::clone
          (RuleAndDistribute *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  const_iterator cVar1;
  RuleAndDistribute *this_00;
  string *__k;
  
  __k = &(this->super_Rule).basegroup;
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)__fn,__k);
  if (cVar1._M_node == (_Base_ptr)(__fn + 8)) {
    this_00 = (RuleAndDistribute *)0x0;
  }
  else {
    this_00 = (RuleAndDistribute *)operator_new(0x58);
    RuleAndDistribute(this_00,__k);
  }
  return (int)this_00;
}

Assistant:

virtual Rule *clone(const ActionGroupList &grouplist) const {
    if (!grouplist.contains(getGroup())) return (Rule *)0;
    return new RuleAndDistribute(getGroup());
  }